

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void demo_textprintf_ex(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,int align,char *format,...)

{
  char in_AL;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined1 local_308 [40];
  undefined8 local_2e0;
  undefined4 local_2b8;
  undefined4 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined4 local_258;
  undefined4 local_254;
  undefined1 *local_250;
  undefined1 *local_248;
  char local_238 [520];
  char *local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM2_Da;
    local_2a8 = in_XMM3_Da;
    local_298 = in_XMM4_Qa;
    local_288 = in_XMM5_Qa;
    local_278 = in_XMM6_Qa;
    local_268 = in_XMM7_Qa;
  }
  local_248 = local_308;
  local_250 = &stack0x00000008;
  local_254 = 0x50;
  local_258 = 0x28;
  local_2e0 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_8 = in_XMM1_Qa;
  vsnprintf(local_238,0x200,in_R8,&local_258);
  if (local_24 == 0) {
    al_draw_textf(local_10,local_8,(float)local_1c,(float)local_20,local_18,0,"%s",local_238);
  }
  else if (local_24 == 1) {
    al_draw_textf(local_10,local_8,(float)local_1c,(float)local_20,local_18,2,"%s",local_238);
  }
  else if (local_24 == 2) {
    al_draw_textf(local_10,local_8,(float)local_1c,(float)local_20,local_18,1,"%s",local_238);
  }
  return;
}

Assistant:

void demo_textprintf_ex(const ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, int align, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   switch (align) {
      case 0:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_LEFT, "%s", buf);
         break;
      case 1:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_RIGHT, "%s", buf);
         break;
      case 2:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_CENTRE, "%s", buf);
         break;
   };

}